

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::Read(ON_PolylineCurve *this,ON_BinaryArchive *file)

{
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_PolylineCurve *this_local;
  
  iStack_1c = 0;
  local_20 = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  local_21 = ON_BinaryArchive::Read3dmChunkVersion(file,&stack0xffffffffffffffe4,&local_20);
  if ((local_21) && (iStack_1c == 1)) {
    if (local_21) {
      local_21 = ON_BinaryArchive::ReadArray
                           (_minor_version,(ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_t);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_dim);
    }
  }
  return local_21;
}

Assistant:

bool ON_PolylineCurve::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) {
    // common to all 1.x versions
    if (rc) rc = file.ReadArray( m_pline );
    if (rc) rc = file.ReadArray( m_t );
    if (rc) rc = file.ReadInt(&m_dim);
  }
  return rc;
}